

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O1

Mat6x6d * __thiscall OpenMD::HydroProp::getS(Mat6x6d *__return_storage_ptr__,HydroProp *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  
  if (this->hasS_ == false) {
    complete(this);
  }
  if (&this->S_ != __return_storage_ptr__) {
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)((long)(this->S_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar8);
      uVar3 = *puVar1;
      uVar4 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)(this->S_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar8 + 0x10);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)(this->S_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar8 + 0x20);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[0] +
               lVar8 + 0x20);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      puVar1 = (undefined8 *)
               ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[0] +
               lVar8 + 0x10);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      puVar1 = (undefined8 *)
               ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[0] + lVar8);
      *puVar1 = uVar3;
      puVar1[1] = uVar4;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0x120);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat6x6d HydroProp::getS() {
    if (!hasS_) { complete(); }
    return S_;
  }